

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFanout.c
# Opt level: O2

void Gia_ObjRemoveFanout(Gia_Man_t *p,Gia_Obj_t *pObj,Gia_Obj_t *pFanout)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (p->pFanData == (int *)0x0) {
LAB_001ed9c2:
    __assert_fail("p->pFanData && Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                  ,0xa6,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar2 = Gia_ObjId(p,pObj);
  if (p->nFansAlloc <= iVar2) goto LAB_001ed9c2;
  iVar2 = Gia_ObjId(p,pFanout);
  if (p->nFansAlloc <= iVar2) goto LAB_001ed9c2;
  if ((((uint)pFanout | (uint)pObj) & 1) != 0) {
    __assert_fail("!Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                  ,0xa7,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar2 = Gia_ObjId(p,pFanout);
  if (iVar2 < 1) {
    __assert_fail("Gia_ObjId(p, pFanout) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                  ,0xa8,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar2 = Gia_ObjId(p,pFanout);
  iVar3 = Gia_ObjWhatFanin(p,pFanout,pObj);
  uVar4 = Gia_FanoutCreate(iVar2,iVar3);
  piVar1 = p->pFanData;
  iVar2 = (int)uVar4 >> 1;
  uVar8 = (ulong)(uVar4 & 1);
  lVar7 = (long)((piVar1[(long)(iVar2 * 5) + uVar8 + 3] >> 1) * 5);
  uVar6 = (ulong)(piVar1[(long)(iVar2 * 5) + uVar8 + 3] & 1);
  if (piVar1[lVar7 + uVar6 + 1] != uVar4) {
    __assert_fail("*pPrev == iFan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                  ,0xae,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  lVar5 = (long)((piVar1[(long)(iVar2 * 5) + uVar8 + 1] >> 1) * 5);
  uVar9 = (ulong)(piVar1[(long)(iVar2 * 5) + uVar8 + 1] & 1);
  if (piVar1[lVar5 + uVar9 + 3] != uVar4) {
    __assert_fail("*pNext == iFan",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                  ,0xaf,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  iVar3 = Gia_ObjId(p,pObj);
  iVar3 = iVar3 * 5;
  if (piVar1[iVar3] < 1) {
    __assert_fail("*pFirst > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaFanout.c"
                  ,0xb1,"void Gia_ObjRemoveFanout(Gia_Man_t *, Gia_Obj_t *, Gia_Obj_t *)");
  }
  if (piVar1[iVar3] == uVar4) {
    if (piVar1[(long)(iVar2 * 5) + uVar8 + 3] == uVar4) {
      piVar1[iVar3] = 0;
      piVar1[lVar7 + uVar6 + 1] = 0;
      iVar3 = 0;
      goto LAB_001ed99e;
    }
    piVar1[iVar3] = piVar1[(long)(iVar2 * 5) + uVar8 + 3];
  }
  piVar1[lVar7 + uVar6 + 1] = piVar1[(long)(iVar2 * 5) + uVar8 + 1];
  iVar3 = piVar1[(long)(iVar2 * 5) + uVar8 + 3];
LAB_001ed99e:
  piVar1[lVar5 + uVar9 + 3] = iVar3;
  piVar1[(long)(iVar2 * 5) + uVar8 + 1] = 0;
  piVar1[(long)(iVar2 * 5) + uVar8 + 3] = 0;
  return;
}

Assistant:

void Gia_ObjRemoveFanout( Gia_Man_t * p, Gia_Obj_t * pObj, Gia_Obj_t * pFanout )
{
    int iFan, * pFirst, * pPrevC, * pNextC, * pPrev, * pNext;
    assert( p->pFanData && Gia_ObjId(p, pObj) < p->nFansAlloc && Gia_ObjId(p, pFanout) < p->nFansAlloc );
    assert( !Gia_IsComplement(pObj) && !Gia_IsComplement(pFanout) );
    assert( Gia_ObjId(p, pFanout) > 0 );
    iFan   = Gia_FanoutCreate( Gia_ObjId(p, pFanout), Gia_ObjWhatFanin(p, pFanout, pObj) );
    pPrevC = Gia_FanoutPrev( p->pFanData, iFan );
    pNextC = Gia_FanoutNext( p->pFanData, iFan );
    pPrev  = Gia_FanoutPrev( p->pFanData, *pNextC );
    pNext  = Gia_FanoutNext( p->pFanData, *pPrevC );
    assert( *pPrev == iFan );
    assert( *pNext == iFan );
    pFirst = Gia_FanoutObj( p->pFanData, Gia_ObjId(p, pObj) );
    assert( *pFirst > 0 );
    if ( *pFirst == iFan )
    {
        if ( *pNextC == iFan )
        {
            *pFirst = 0;
            *pPrev  = 0;
            *pNext  = 0;
            *pPrevC = 0;
            *pNextC = 0;
            return;
        }
        *pFirst = *pNextC;
    }
    *pPrev  = *pPrevC;
    *pNext  = *pNextC;
    *pPrevC = 0;
    *pNextC = 0;
}